

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O0

void test_tcp_stream(void)

{
  uint16_t uVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  bool bVar6;
  nng_err result__16;
  nng_err result__15;
  nng_err result__14;
  nng_err result__13;
  nng_err result__12;
  nng_err result__11;
  nng_err result__10;
  nng_err result__9;
  nng_err result__8;
  char uri [64];
  nng_err result__7;
  nng_err result__6;
  nng_err result__5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  _Bool on;
  char buf2 [5];
  char buf1 [5];
  nng_sockaddr sa2;
  nng_iov iov;
  nng_aio *aio2;
  nng_aio *aio1;
  nng_stream *c2;
  nng_stream *c1;
  nng_aio *maio;
  nng_aio *laio;
  nng_aio *daio;
  undefined1 local_a0 [4];
  uint8_t ip [4];
  nng_sockaddr sa;
  nng_stream_listener *l;
  nng_stream_dialer *d;
  
  l = (nng_stream_listener *)0x0;
  sa.s_storage.sa_pad[0xf] = 0;
  laio = (nng_aio *)0x0;
  maio = (nng_aio *)0x0;
  c1 = (nng_stream *)0x0;
  c2 = (nng_stream *)0x0;
  aio1 = (nng_aio *)0x0;
  nVar2 = nng_aio_alloc(&laio,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x26,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&daio, NULL, NULL)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_aio_alloc(&maio,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x27,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&laio, NULL, NULL)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_aio_alloc((nng_aio **)&c1,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x28,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&maio, NULL, NULL)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_aio_alloc(&aio2,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x29,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&aio1, NULL, NULL)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_aio_alloc((nng_aio **)&iov.iov_len,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x2a,"%s: expected success, got %s (%d)",
                         "nng_aio_alloc(&aio2, NULL, NULL)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_stream_listener_alloc
                    ((nng_stream_listener **)(sa.s_storage.sa_pad + 0xf),"tcp://127.0.0.1");
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x2c,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l, \"tcp://127.0.0.1\")",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nVar2 = nng_stream_listener_listen((nng_stream_listener *)sa.s_storage.sa_pad[0xf]);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x2d,"%s: expected success, got %s (%d)","nng_stream_listener_listen(l)",
                         pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  daio._4_1_ = '\x7f';
  daio._5_1_ = '\0';
  daio._6_1_ = '\0';
  daio._7_1_ = '\x01';
  uri._60_4_ = nng_stream_listener_get_addr
                         ((nng_stream_listener *)sa.s_storage.sa_pad[0xf],"local-address",
                          (nng_sockaddr *)local_a0);
  bVar6 = uri._60_4_ == NNG_OK;
  pcVar4 = nng_strerror(uri._60_4_);
  iVar3 = acutest_check_((uint)bVar6,
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x33,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_get_addr(l, NNG_OPT_LOCADDR, &sa)",pcVar4,uri._60_4_);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(local_a0._2_2_ != 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x34,"%s","sa.s_in.sa_port != 0");
  acutest_check_((uint)(ip == daio._4_4_),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x35,"%s","memcmp(&sa.s_in.sa_addr, ip, 4) == 0");
  uVar1 = nuts_be16(local_a0._2_2_);
  snprintf((char *)&result__9,0x40,"tcp://127.0.0.1:%d",(ulong)uVar1);
  nVar2 = nng_stream_dialer_alloc((nng_stream_dialer **)&l,(char *)&result__9);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x3b,"%s: expected success, got %s (%d)",
                         "nng_stream_dialer_alloc(&d, uri)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nng_stream_dialer_dial((nng_stream_dialer *)l,laio);
  nng_stream_listener_accept((nng_stream_listener *)sa.s_storage.sa_pad[0xf],maio);
  nng_aio_wait(laio);
  nVar2 = nng_aio_result(laio);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x40,"%s: expected success, got %s (%d)","nng_aio_result(daio)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  nng_aio_wait(maio);
  nVar2 = nng_aio_result(maio);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x42,"%s: expected success, got %s (%d)","nng_aio_result(laio)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  c2 = (nng_stream *)nng_aio_get_output(laio,0);
  aio1 = (nng_aio *)nng_aio_get_output(maio,0);
  acutest_check_((uint)(c2 != (nng_stream *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x46,"%s","c1 != NULL");
  acutest_check_((uint)(aio1 != (nng_aio *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x47,"%s","c2 != NULL");
  result__1._1_1_ = NNG_OK >> 8;
  nVar2 = nng_stream_get_bool(c2,"tcp-nodelay",(_Bool *)((long)&result__1 + 1));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x4a,"%s: expected success, got %s (%d)",
                         "nng_stream_get_bool(c1, NNG_OPT_TCP_NODELAY, &on)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(byte)(result__1._1_1_ & 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x4b,"%s","on");
  result__1._1_1_ = NNG_OK >> 8;
  nVar2 = nng_stream_get_bool(c2,"tcp-keepalive",(_Bool *)((long)&result__1 + 1));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x4e,"%s: expected success, got %s (%d)",
                         "nng_stream_get_bool(c1, NNG_OPT_TCP_KEEPALIVE, &on)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  stack0xfffffffffffffe83 = 0x54534554;
  buf2[1] = '\0';
  memset((byte *)((long)&result__1 + 2),0,5);
  sa2.s_storage.sa_pad[0xf] = (long)&result_ + 3;
  iov.iov_buf = (void *)0x5;
  nng_aio_set_iov(aio2,1,(nng_iov *)(sa2.s_ipc.sa_path + 0x7e));
  sa2.s_storage.sa_pad[0xf] = (long)&result__1 + 2;
  iov.iov_buf = (void *)0x5;
  nng_aio_set_iov((nng_aio *)iov.iov_len,1,(nng_iov *)(sa2.s_ipc.sa_path + 0x7e));
  nng_stream_send(c2,aio2);
  nng_stream_recv((nng_stream *)aio1,(nng_aio *)iov.iov_len);
  nng_aio_wait(aio2);
  nng_aio_wait((nng_aio *)iov.iov_len);
  nVar2 = nng_aio_result(aio2);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,100,"%s: expected success, got %s (%d)","nng_aio_result(aio1)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  sVar5 = nng_aio_count(aio2);
  acutest_check_((uint)(sVar5 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x65,"%s","nng_aio_count(aio1) == 5");
  nVar2 = nng_aio_result((nng_aio *)iov.iov_len);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x67,"%s: expected success, got %s (%d)","nng_aio_result(aio2)",pcVar4,
                         nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  sVar5 = nng_aio_count((nng_aio *)iov.iov_len);
  acutest_check_((uint)(sVar5 == 5),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x68,"%s","nng_aio_count(aio2) == 5");
  iVar3 = memcmp((byte *)((long)&result_ + 3),(byte *)((long)&result__1 + 2),5);
  acutest_check_((uint)(iVar3 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x6a,"%s","memcmp(buf1, buf2, 5) == 0");
  nVar2 = nng_stream_get_addr((nng_stream *)aio1,"local-address",(nng_sockaddr *)(buf2 + 2));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x6c,"%s: expected success, got %s (%d)",
                         "nng_stream_get_addr(c2, NNG_OPT_LOCADDR, &sa2)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(buf2._2_2_ == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x6d,"%s","sa2.s_in.sa_family == NNG_AF_INET");
  acutest_check_((uint)((uint8_t  [4])buf1._1_4_ == ip),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x6f,"%s","sa2.s_in.sa_addr == sa.s_in.sa_addr");
  acutest_check_((uint)(stack0xfffffffffffffe8a == local_a0._2_2_),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x70,"%s","sa2.s_in.sa_port == sa.s_in.sa_port");
  nVar2 = nng_stream_get_addr(c2,"remote-address",(nng_sockaddr *)(buf2 + 2));
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x72,"%s: expected success, got %s (%d)",
                         "nng_stream_get_addr(c1, NNG_OPT_REMADDR, &sa2)",pcVar4,nVar2);
  if (iVar3 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(buf2._2_2_ == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x73,"%s","sa2.s_in.sa_family == NNG_AF_INET");
  acutest_check_((uint)((uint8_t  [4])buf1._1_4_ == ip),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x74,"%s","sa2.s_in.sa_addr == sa.s_in.sa_addr");
  acutest_check_((uint)(stack0xfffffffffffffe8a == local_a0._2_2_),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x75,"%s","sa2.s_in.sa_port == sa.s_in.sa_port");
  nng_stream_listener_free((nng_stream_listener *)sa.s_storage.sa_pad[0xf]);
  nng_stream_dialer_free((nng_stream_dialer *)l);
  nng_aio_free(aio2);
  nng_aio_free((nng_aio *)iov.iov_len);
  nng_aio_free(laio);
  nng_aio_free(maio);
  nng_aio_free((nng_aio *)c1);
  nng_stream_close(c2);
  nng_stream_close((nng_stream *)aio1);
  nng_stream_stop(c2);
  nng_stream_stop((nng_stream *)aio1);
  nng_stream_free(c2);
  nng_stream_free((nng_stream *)aio1);
  return;
}

Assistant:

void
test_tcp_stream(void)
{
	nng_stream_dialer   *d = NULL;
	nng_stream_listener *l = NULL;
	nng_sockaddr         sa;
	uint8_t              ip[4];
	nng_aio             *daio = NULL;
	nng_aio             *laio = NULL;
	nng_aio             *maio = NULL;
	nng_stream          *c1   = NULL;
	nng_stream          *c2   = NULL;
	nng_aio             *aio1;
	nng_aio             *aio2;
	nng_iov              iov;
	nng_sockaddr         sa2;
	char                 buf1[5];
	char                 buf2[5];
	bool                 on;

	NUTS_PASS(nng_aio_alloc(&daio, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&laio, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&maio, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio1, NULL, NULL));
	NUTS_PASS(nng_aio_alloc(&aio2, NULL, NULL));

	NUTS_PASS(nng_stream_listener_alloc(&l, "tcp://127.0.0.1"));
	NUTS_PASS(nng_stream_listener_listen(l));

	ip[0] = 127;
	ip[1] = 0;
	ip[2] = 0;
	ip[3] = 1;
	NUTS_PASS(nng_stream_listener_get_addr(l, NNG_OPT_LOCADDR, &sa));
	NUTS_TRUE(sa.s_in.sa_port != 0);
	NUTS_TRUE(memcmp(&sa.s_in.sa_addr, ip, 4) == 0);

	char uri[64];
	snprintf(uri, sizeof(uri), "tcp://127.0.0.1:%d",
	    nuts_be16(sa.s_in.sa_port));

	NUTS_PASS(nng_stream_dialer_alloc(&d, uri));
	nng_stream_dialer_dial(d, daio);
	nng_stream_listener_accept(l, laio);

	nng_aio_wait(daio);
	NUTS_PASS(nng_aio_result(daio));
	nng_aio_wait(laio);
	NUTS_PASS(nng_aio_result(laio));

	c1 = nng_aio_get_output(daio, 0);
	c2 = nng_aio_get_output(laio, 0);
	NUTS_TRUE(c1 != NULL);
	NUTS_TRUE(c2 != NULL);

	on = false;
	NUTS_PASS(nng_stream_get_bool(c1, NNG_OPT_TCP_NODELAY, &on));
	NUTS_TRUE(on);

	on = false;
	NUTS_PASS(nng_stream_get_bool(c1, NNG_OPT_TCP_KEEPALIVE, &on));

	// This relies on send completing for
	// for just 5 bytes, and on recv doing
	// the same.  Technically this isn't
	// guaranteed, but it would be weird
	// to split such a small payload.
	memcpy(buf1, "TEST", 5);
	memset(buf2, 0, 5);
	iov.iov_buf = buf1;
	iov.iov_len = 5;

	nng_aio_set_iov(aio1, 1, &iov);

	iov.iov_buf = buf2;
	iov.iov_len = 5;
	nng_aio_set_iov(aio2, 1, &iov);
	nng_stream_send(c1, aio1);
	nng_stream_recv(c2, aio2);
	nng_aio_wait(aio1);
	nng_aio_wait(aio2);

	NUTS_PASS(nng_aio_result(aio1));
	NUTS_TRUE(nng_aio_count(aio1) == 5);

	NUTS_PASS(nng_aio_result(aio2));
	NUTS_TRUE(nng_aio_count(aio2) == 5);

	NUTS_TRUE(memcmp(buf1, buf2, 5) == 0);

	NUTS_PASS(nng_stream_get_addr(c2, NNG_OPT_LOCADDR, &sa2));
	NUTS_TRUE(sa2.s_in.sa_family == NNG_AF_INET);

	NUTS_TRUE(sa2.s_in.sa_addr == sa.s_in.sa_addr);
	NUTS_TRUE(sa2.s_in.sa_port == sa.s_in.sa_port);

	NUTS_PASS(nng_stream_get_addr(c1, NNG_OPT_REMADDR, &sa2));
	NUTS_TRUE(sa2.s_in.sa_family == NNG_AF_INET);
	NUTS_TRUE(sa2.s_in.sa_addr == sa.s_in.sa_addr);
	NUTS_TRUE(sa2.s_in.sa_port == sa.s_in.sa_port);

	nng_stream_listener_free(l);
	nng_stream_dialer_free(d);
	nng_aio_free(aio1);
	nng_aio_free(aio2);
	nng_aio_free(daio);
	nng_aio_free(laio);
	nng_aio_free(maio);
	nng_stream_close(c1);
	nng_stream_close(c2);
	nng_stream_stop(c1);
	nng_stream_stop(c2);
	nng_stream_free(c1);
	nng_stream_free(c2);
}